

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCFGReader.cpp
# Opt level: O3

void __thiscall DCFGReader::~DCFGReader(DCFGReader *this)

{
  (this->super_CFGReader)._vptr_CFGReader = (_func_int **)&PTR__DCFGReader_0012aab8;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->m_visited)._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->m_entries)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_DCFGReader::Symbol>,_std::_Select1st<std::pair<const_unsigned_long,_DCFGReader::Symbol>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_DCFGReader::Symbol>_>_>
  ::~_Rb_tree(&(this->m_symbols)._M_t);
  std::__cxx11::_List_base<DCFGReader::Routine,_std::allocator<DCFGReader::Routine>_>::_M_clear
            (&(this->m_routines).
              super__List_base<DCFGReader::Routine,_std::allocator<DCFGReader::Routine>_>);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>_>_>_>
  ::~_Rb_tree(&(this->m_edges)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_DCFGReader::Node>,_std::_Select1st<std::pair<const_int,_DCFGReader::Node>_>,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
  ::~_Rb_tree(&(this->m_nodes)._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_filenames);
  CFGReader::~CFGReader(&this->super_CFGReader);
  return;
}

Assistant:

DCFGReader::~DCFGReader() {
}